

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

double __thiscall
wasm::Random::
pick<double,double,float,float,double,double,int,int,long,long,unsigned_int,unsigned_long>
          (Random *this,double first,double args,float args_1,float args_2,double args_3,
          double args_4,int args_5,int args_6,long args_7,long args_8,uint args_9,
          unsigned_long args_10)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar1 = upTo(this,0xc);
  if ((uVar1 != 0) && (first = args, uVar1 != 1)) {
    uVar2 = (ulong)uVar1;
    if (uVar2 == 2) {
      first = (double)args_1;
    }
    else if (uVar2 == 3) {
      first = (double)args_2;
    }
    else {
      first = pickGivenNum<double,double,int,int,long,long,unsigned_int,unsigned_long>
                        (this,uVar2 - 4,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10);
    }
  }
  return first;
}

Assistant:

T pick(T first, Args... args) {
    auto num = sizeof...(Args) + 1;
    auto temp = upTo(num);
    return pickGivenNum<T>(temp, first, args...);
  }